

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,ObjectComprehension *comp)

{
  Kind KVar1;
  pointer pFVar2;
  uint uVar3;
  ObjectField *field;
  pointer pOVar4;
  pointer pCVar5;
  ostream *poVar6;
  const_iterator __begin2_2;
  pointer pFVar7;
  const_iterator __begin2;
  Fodder *pFVar8;
  int iVar9;
  int iVar10;
  
  for (pOVar4 = (comp->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pOVar4 != (comp->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_finish; pOVar4 = pOVar4 + 1) {
    pFVar8 = &pOVar4->fodder1;
    if (pOVar4->kind == FIELD_STR) {
      pFVar8 = &pOVar4->expr1->openFodder;
    }
    pFVar7 = (pFVar8->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (pFVar8->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar7 != pFVar2) {
      iVar9 = 0;
      do {
        KVar1 = pFVar7->kind;
        if (KVar1 == PARAGRAPH) {
          iVar10 = (int)((ulong)((long)(pFVar7->comment).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pFVar7->comment).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                   pFVar7->blanks;
        }
        else {
          iVar10 = 0;
          if (KVar1 != INTERSTITIAL) {
            if (KVar1 != LINE_END) goto LAB_001ac552;
            iVar10 = 1;
          }
        }
        iVar9 = iVar9 + iVar10;
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar2);
      if (0 < iVar9) goto LAB_001ac54e;
    }
  }
  for (pCVar5 = (comp->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar5 != (comp->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
    pFVar7 = (pCVar5->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (pCVar5->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar7 != pFVar2) {
      iVar9 = 0;
      do {
        KVar1 = pFVar7->kind;
        if (KVar1 == PARAGRAPH) {
          iVar10 = (int)((ulong)((long)(pFVar7->comment).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pFVar7->comment).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                   pFVar7->blanks;
        }
        else {
          iVar10 = 0;
          if (KVar1 != INTERSTITIAL) {
            if (KVar1 != LINE_END) goto LAB_001ac552;
            iVar10 = 1;
          }
        }
        iVar9 = iVar9 + iVar10;
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar2);
      if (0 < iVar9) goto LAB_001ac54e;
    }
  }
  pFVar7 = (comp->closeFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (comp->closeFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  if (pFVar7 != pFVar2) {
    do {
      KVar1 = pFVar7->kind;
      if (KVar1 == PARAGRAPH) {
        iVar9 = (int)((ulong)((long)(pFVar7->comment).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar7->comment).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) + pFVar7->blanks
        ;
      }
      else {
        iVar9 = 0;
        if (KVar1 != INTERSTITIAL) {
          if (KVar1 != LINE_END) {
LAB_001ac552:
            poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown FodderElement kind");
            std::endl<char,std::char_traits<char>>(poVar6);
            abort();
          }
          iVar9 = 1;
        }
      }
      uVar3 = uVar3 + iVar9;
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != pFVar2);
    uVar3 = (uint)(0 < (int)uVar3);
  }
LAB_001ac550:
  return SUB41(uVar3,0);
LAB_001ac54e:
  uVar3 = 1;
  goto LAB_001ac550;
}

Assistant:

bool shouldExpand(ObjectComprehension *comp)
    {
        for (auto &field : comp->fields) {
            if (countNewlines(objectFieldOpenFodder(field)) > 0) {
                return true;
            }
        }
        for (auto &spec : comp->specs) {
            if (countNewlines(spec.openFodder) > 0) {
                return true;
            }
        }
        if (countNewlines(comp->closeFodder) > 0) {
            return true;
        }
        return false;
    }